

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

int __thiscall
vkt::shaderexecutor::BuiltinPrecisionTests::init(BuiltinPrecisionTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  ShaderType local_5c;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> local_58;
  CaseFactories *local_38;
  CaseFactories *local_28;
  
  local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_start = (ShaderType *)0x0;
  local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_finish = (ShaderType *)0x0;
  local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (ShaderType *)0x0;
  createComputeOnlyBuiltinCases();
  createCompleteBuiltinCases();
  local_5c = SHADERTYPE_COMPUTE;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::_M_realloc_insert<glu::ShaderType>
            (&local_58,(iterator)0x0,&local_5c);
  addBuiltinPrecisionTests
            ((this->super_TestCaseGroup).super_TestNode.m_testCtx,local_28,&local_58,
             &this->super_TestCaseGroup);
  if (local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_5c = SHADERTYPE_VERTEX;
  if (local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_58,
               (iterator)
               local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_5c);
  }
  else {
    *local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_VERTEX;
    local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_5c = SHADERTYPE_FRAGMENT;
  if (local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_58,
               (iterator)
               local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_5c);
  }
  else {
    *local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_FRAGMENT;
    local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_5c = SHADERTYPE_COMPUTE;
  if (local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_58,
               (iterator)
               local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_5c);
  }
  else {
    *local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_COMPUTE;
    local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  addBuiltinPrecisionTests
            ((this->super_TestCaseGroup).super_TestNode.m_testCtx,local_38,&local_58,
             &this->super_TestCaseGroup);
  (*local_38->_vptr_CaseFactories[1])(local_38);
  iVar1 = (*local_28->_vptr_CaseFactories[1])(local_28);
  if (local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_start != (ShaderType *)0x0) {
    operator_delete(local_58.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void BuiltinPrecisionTests::init (void)
{
	std::vector<glu::ShaderType>		shaderTypes;
	de::MovePtr<const CaseFactories>	computeOnlyCases	= createComputeOnlyBuiltinCases();
	de::MovePtr<const CaseFactories>	completeCases		= createCompleteBuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	addBuiltinPrecisionTests(m_testCtx,
							 *computeOnlyCases,
							 shaderTypes,
							 *this);

	shaderTypes.clear();
	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);
	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	addBuiltinPrecisionTests(m_testCtx,
							 *completeCases,
							 shaderTypes,
							 *this);
}